

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O1

vector<DataSet,_std::allocator<DataSet>_> * __thiscall
DataSet::split(vector<DataSet,_std::allocator<DataSet>_> *__return_storage_ptr__,DataSet *this,
              initializer_list<double> percentages)

{
  Matrix<double> *matrix;
  double *pdVar1;
  uint uVar2;
  uint beg_row;
  double *pdVar3;
  long lVar4;
  uint end_row;
  DataSet local_c8;
  
  pdVar3 = percentages._M_array;
  (__return_storage_ptr__->super__Vector_base<DataSet,_std::allocator<DataSet>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<DataSet,_std::allocator<DataSet>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<DataSet,_std::allocator<DataSet>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar1 = pdVar3 + percentages._M_len;
  matrix = &this->m_matrix;
  lVar4 = percentages._M_len * 8;
  beg_row = 0;
  do {
    lVar4 = lVar4 + -8;
    if (pdVar1 <= pdVar3) {
      return __return_storage_ptr__;
    }
    uVar2 = (matrix->m_shape).n_row;
    end_row = (int)(long)(((double)uVar2 * *pdVar3) / 100.0) + beg_row;
    if (uVar2 <= end_row) {
      end_row = uVar2;
    }
    if (lVar4 == 0) {
      end_row = uVar2;
    }
    DataSet(&local_c8,matrix,beg_row,end_row,&this->m_labels);
    std::vector<DataSet,_std::allocator<DataSet>_>::emplace_back<DataSet>
              (__return_storage_ptr__,&local_c8);
    pdVar3 = pdVar3 + 1;
    ~DataSet(&local_c8);
    beg_row = end_row;
  } while (end_row != (matrix->m_shape).n_row);
  return __return_storage_ptr__;
}

Assistant:

std::vector<DataSet> DataSet::split(const std::initializer_list<double> percentages){
    std::vector<DataSet> datasets;
    unsigned beg, end, size=0;
    auto percentage=percentages.begin();

    for(unsigned i=0;percentage<percentages.end();++percentage){
        size=m_matrix.shape().n_row*(*percentage)/100.;
        beg=i;
        end=beg+size;
        if(end>m_matrix.shape().n_row) end=m_matrix.shape().n_row;
        if(percentage+1==percentages.end() && end!=m_matrix.shape().n_row)
            end=m_matrix.shape().n_row;
        i=end;
        datasets.push_back(DataSet(m_matrix, beg, end, m_labels));

        if(end==m_matrix.shape().n_row) break;
    }

    return datasets;
}